

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int c14nRunTest(char *xml_filename,int with_comments,int mode,char *xpath_filename,char *ns_filename
               ,char *result_file)

{
  int iVar1;
  long lVar2;
  undefined8 local_80;
  int local_6c;
  xmlChar *pxStack_68;
  int nssize;
  char *nslist;
  xmlChar **inclusive_namespaces;
  char *pcStack_50;
  int ret;
  xmlChar *result;
  xmlXPathObjectPtr xpath;
  xmlDocPtr doc;
  char *result_file_local;
  char *ns_filename_local;
  char *xpath_filename_local;
  int mode_local;
  int with_comments_local;
  char *xml_filename_local;
  
  result = (xmlChar *)0x0;
  pcStack_50 = (char *)0x0;
  nslist = (char *)0x0;
  pxStack_68 = (xmlChar *)0x0;
  doc = (xmlDocPtr)result_file;
  result_file_local = ns_filename;
  ns_filename_local = xpath_filename;
  xpath_filename_local._0_4_ = mode;
  xpath_filename_local._4_4_ = with_comments;
  _mode_local = xml_filename;
  xpath = (xmlXPathObjectPtr)xmlReadFile(xml_filename,0,0x4a);
  if (xpath == (xmlXPathObjectPtr)0x0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",_mode_local);
    xml_filename_local._4_4_ = 0xffffffff;
  }
  else {
    lVar2 = xmlDocGetRootElement(xpath);
    if (lVar2 == 0) {
      fprintf(_stderr,"Error: empty document for file \"%s\"\n",_mode_local);
      xmlFreeDoc(xpath);
      xml_filename_local._4_4_ = 0xffffffff;
    }
    else if ((ns_filename_local == (char *)0x0) ||
            (result = (xmlChar *)load_xpath_expr((xmlDocPtr)xpath,ns_filename_local),
            (xmlXPathObjectPtr)result != (xmlXPathObjectPtr)0x0)) {
      if (result_file_local != (char *)0x0) {
        iVar1 = loadMem(result_file_local,(char **)&stack0xffffffffffffff98,&local_6c);
        if (iVar1 != 0) {
          fprintf(_stderr,"Error: unable to evaluate xpath expression\n");
          if (result != (xmlChar *)0x0) {
            xmlXPathFreeObject(result);
          }
          xmlFreeDoc(xpath);
          return -1;
        }
        nslist = (char *)parse_list(pxStack_68);
      }
      if (result == (xmlChar *)0x0) {
        local_80 = 0;
      }
      else {
        local_80 = *(undefined8 *)(result + 8);
      }
      inclusive_namespaces._4_4_ =
           xmlC14NDocDumpMemory
                     (xpath,local_80,(int)xpath_filename_local,nslist,xpath_filename_local._4_4_,
                      &stack0xffffffffffffffb0);
      if ((int)inclusive_namespaces._4_4_ < 0) {
        fprintf(_stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n",_mode_local,
                (ulong)inclusive_namespaces._4_4_);
        inclusive_namespaces._4_4_ = 0xffffffff;
      }
      else if ((pcStack_50 != (char *)0x0) &&
              (iVar1 = compareFileMem((char *)doc,pcStack_50,inclusive_namespaces._4_4_), iVar1 != 0
              )) {
        fprintf(_stderr,"Result mismatch for %s\n",_mode_local);
        fprintf(_stderr,"RESULT:\n%s\n",pcStack_50);
        inclusive_namespaces._4_4_ = 0xffffffff;
      }
      if (pcStack_50 != (char *)0x0) {
        (*_xmlFree)(pcStack_50);
      }
      if (result != (xmlChar *)0x0) {
        xmlXPathFreeObject(result);
      }
      if (nslist != (char *)0x0) {
        (*_xmlFree)(nslist);
      }
      if (pxStack_68 != (xmlChar *)0x0) {
        free(pxStack_68);
      }
      xmlFreeDoc(xpath);
      xml_filename_local._4_4_ = inclusive_namespaces._4_4_;
    }
    else {
      fprintf(_stderr,"Error: unable to evaluate xpath expression\n");
      xmlFreeDoc(xpath);
      xml_filename_local._4_4_ = 0xffffffff;
    }
  }
  return xml_filename_local._4_4_;
}

Assistant:

static int
c14nRunTest(const char* xml_filename, int with_comments, int mode,
	    const char* xpath_filename, const char *ns_filename,
	    const char* result_file) {
    xmlDocPtr doc;
    xmlXPathObjectPtr xpath = NULL;
    xmlChar *result = NULL;
    int ret;
    xmlChar **inclusive_namespaces = NULL;
    const char *nslist = NULL;
    int nssize;


    /*
     * build an XML tree from a the file; we need to add default
     * attributes and resolve all character and entities references
     */
    doc = xmlReadFile(xml_filename, NULL,
            XML_PARSE_DTDATTR | XML_PARSE_NOENT | XML_PARSE_NOWARNING);
    if (doc == NULL) {
	fprintf(stderr, "Error: unable to parse file \"%s\"\n", xml_filename);
	return(-1);
    }

    /*
     * Check the document is of the right kind
     */
    if(xmlDocGetRootElement(doc) == NULL) {
        fprintf(stderr,"Error: empty document for file \"%s\"\n", xml_filename);
	xmlFreeDoc(doc);
	return(-1);
    }

    /*
     * load xpath file if specified
     */
    if(xpath_filename) {
	xpath = load_xpath_expr(doc, xpath_filename);
	if(xpath == NULL) {
	    fprintf(stderr,"Error: unable to evaluate xpath expression\n");
	    xmlFreeDoc(doc);
	    return(-1);
	}
    }

    if (ns_filename != NULL) {
        if (loadMem(ns_filename, &nslist, &nssize)) {
	    fprintf(stderr,"Error: unable to evaluate xpath expression\n");
	    if(xpath != NULL) xmlXPathFreeObject(xpath);
	    xmlFreeDoc(doc);
	    return(-1);
	}
        inclusive_namespaces = parse_list((xmlChar *) nslist);
    }

    /*
     * Canonical form
     */
    /* fprintf(stderr,"File \"%s\" loaded: start canonization\n", xml_filename); */
    ret = xmlC14NDocDumpMemory(doc,
	    (xpath) ? xpath->nodesetval : NULL,
	    mode, inclusive_namespaces,
	    with_comments, &result);
    if (ret >= 0) {
	if(result != NULL) {
	    if (compareFileMem(result_file, (const char *) result, ret)) {
		fprintf(stderr, "Result mismatch for %s\n", xml_filename);
		fprintf(stderr, "RESULT:\n%s\n", (const char*)result);
	        ret = -1;
	    }
	}
    } else {
	fprintf(stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n", xml_filename, ret);
	ret = -1;
    }

    /*
     * Cleanup
     */
    if (result != NULL) xmlFree(result);
    if(xpath != NULL) xmlXPathFreeObject(xpath);
    if (inclusive_namespaces != NULL) xmlFree(inclusive_namespaces);
    if (nslist != NULL) free((char *) nslist);
    xmlFreeDoc(doc);

    return(ret);
}